

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator-=(TPZFMatrix<Fad<float>_> *this,Fad<float> *val)

{
  TPZFMatrix<Fad<float>_> *this_00;
  Fad<float> *in_RDI;
  Fad<float> *in_stack_ffffffffffffffc8;
  TPZFMatrix<Fad<float>_> *in_stack_ffffffffffffffd0;
  FadExpr<FadUnaryMin<Fad<float>_>_> *in_stack_ffffffffffffffd8;
  Fad<float> *in_stack_ffffffffffffffe0;
  
  Fad<float>::operator-(in_RDI);
  Fad<float>::Fad<FadUnaryMin<Fad<float>>>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  this_00 = operator+=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  Fad<float>::~Fad((Fad<float> *)this_00);
  FadExpr<FadUnaryMin<Fad<float>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<float>_>_> *)0x127f5e2);
  return this_00;
}

Assistant:

TPZFMatrix<TVar> &operator-=(const TVar val )  { return operator+=( -val ); }